

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O3

string * __thiscall
ShOpcodeFormatter::formatOpcode_abi_cxx11_
          (ShOpcodeFormatter *this,ShOpcodeData *opData,ShRegisterData *regData,
          ShImmediateData *immData)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)(this->buffer)._M_string_length,0x18fba2);
  pcVar3 = (opData->opcode).name;
  cVar1 = *pcVar3;
  while (cVar1 != '\0') {
    pcVar3 = pcVar3 + 1;
    std::__cxx11::string::push_back((char)this);
    cVar1 = *pcVar3;
  }
  uVar2 = (this->buffer)._M_string_length;
  while (uVar2 < 0xb) {
    std::__cxx11::string::push_back((char)this);
    uVar2 = (this->buffer)._M_string_length;
  }
  handleOpcodeParameters(this,opData,regData,immData);
  return &this->buffer;
}

Assistant:

const std::string& ShOpcodeFormatter::formatOpcode(const ShOpcodeData& opData, const ShRegisterData& regData,
	const ShImmediateData& immData)
{
	buffer = "   ";
	handleOpcodeName(opData);

	while (buffer.size() < 11)
		buffer += ' ';

	handleOpcodeParameters(opData,regData,immData);
	return buffer;
}